

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blobs.cpp
# Opt level: O0

void local_sum(Block *b,ProxyWithLink *cp)

{
  bool bVar1;
  int iVar2;
  reference plVar3;
  result_type_conflict rVar4;
  BlockID *to;
  Proxy *this;
  char *__to;
  ProxyWithLink *in_RSI;
  long **__from;
  vector<long,_std::allocator<long>_> *in_RDI;
  int i;
  Link *l;
  long *v;
  iterator __end1;
  iterator __begin1;
  vector<long,_std::allocator<long>_> *__range1;
  int64_t sum;
  uniform_int_distribution<long> distribution;
  default_random_engine generator;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  uniform_int_distribution<long> *in_stack_ffffffffffffff80;
  ProxyWithLink *this_00;
  int local_5c;
  long *local_48;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_40;
  vector<long,_std::allocator<long>_> *local_38;
  long local_30;
  ProxyWithLink *local_10;
  vector<long,_std::allocator<long>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  diy::Master::Proxy::gid(&in_RSI->super_Proxy);
  Catch::clara::std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             in_stack_ffffffffffffff80,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
            );
  Catch::clara::std::uniform_int_distribution<long>::uniform_int_distribution
            (in_stack_ffffffffffffff80,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
             ,0x14b421);
  local_30 = 0;
  local_38 = local_8;
  local_40._M_current =
       (long *)Catch::clara::std::vector<long,_std::allocator<long>_>::begin
                         ((vector<long,_std::allocator<long>_> *)
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_48 = (long *)Catch::clara::std::vector<long,_std::allocator<long>_>::end
                               ((vector<long,_std::allocator<long>_> *)
                                CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  while( true ) {
    __from = &local_48;
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                       in_stack_ffffffffffffff80,
                       (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (!bVar1) break;
    plVar3 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
             operator*(&local_40);
    rVar4 = std::uniform_int_distribution<long>::operator()
                      (in_stack_ffffffffffffff80,
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    *plVar3 = rVar4;
    local_30 = *plVar3 + local_30;
    __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
              (&local_40);
  }
  diy::Master::ProxyWithLink::link(local_10,(char *)__from,__to);
  local_5c = 0;
  while( true ) {
    iVar2 = diy::Link::size((Link *)0x14b4da);
    if (iVar2 <= local_5c) break;
    this_00 = local_10;
    to = diy::Link::target((Link *)local_10,in_stack_ffffffffffffff7c);
    this = (Proxy *)Catch::clara::std::vector<long,_std::allocator<long>_>::data
                              ((vector<long,_std::allocator<long>_> *)0x14b512);
    Catch::clara::std::vector<long,_std::allocator<long>_>::size(local_8);
    diy::Master::Proxy::enqueue_blob
              (this,to,(char *)this_00,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
              );
    diy::Link::target((Link *)this_00,in_stack_ffffffffffffff7c);
    diy::Master::Proxy::enqueue<long>
              (this,to,(long *)this_00,
               (_func_void_BinaryBuffer_ptr_long_ptr *)
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    local_5c = local_5c + 1;
  }
  return;
}

Assistant:

void local_sum(Block* b, const diy::Master::ProxyWithLink& cp)
{
    std::default_random_engine generator(cp.gid());
    std::uniform_int_distribution<std::int64_t> distribution(-9, 9);

    std::int64_t sum = 0;
    for (auto &v : b->buffer)
    {
      v = distribution(generator);
      sum += v;
    }

    diy::Link* l = cp.link();
    for (int i = 0; i < l->size(); ++i)
    {
      cp.enqueue_blob(l->target(i), (const char*) b->buffer.data(), b->buffer.size() * sizeof(std::int64_t));
      cp.enqueue(l->target(i), sum);
    }
}